

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.c
# Opt level: O0

enet_uint32 reflect_crc(int val,int bits)

{
  undefined4 local_18;
  undefined4 local_14;
  int bit;
  int result;
  int bits_local;
  int val_local;
  
  local_14 = 0;
  result = val;
  for (local_18 = 0; local_18 < bits; local_18 = local_18 + 1) {
    if ((result & 1U) != 0) {
      local_14 = 1 << (((char)bits + -1) - (char)local_18 & 0x1fU) | local_14;
    }
    result = result >> 1;
  }
  return local_14;
}

Assistant:

static enet_uint32 
reflect_crc (int val, int bits)
{
    int result = 0, bit;

    for (bit = 0; bit < bits; bit ++)
    {
        if(val & 1) result |= 1 << (bits - 1 - bit); 
        val >>= 1;
    }

    return result;
}